

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reduction.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeReduction(ConvertLayerParameters layerParameters)

{
  uint uVar1;
  Rep *pRVar2;
  ConvolutionLayerParams *pCVar3;
  uint __val;
  uint uVar4;
  Type *pTVar5;
  Type *pTVar6;
  ReduceLayerParams *this;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint __len;
  void **ppvVar10;
  ReductionParameter *pRVar11;
  long lVar12;
  long in_stack_00000008;
  string *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_c8;
  string *local_a8;
  Type *local_a0;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string *local_38;
  
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*(int *)__str.field_2._8_8_
                     );
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     ((RepeatedPtrFieldBase *)in_stack_00000018,(Type *)0x0);
  if (((pTVar5->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((pTVar5->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"Must have 1 input and 1 output","");
    errorInCaffeProto(&local_c8,(pTVar5->name_).ptr_,(pTVar5->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  local_a8 = in_stack_00000018;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar5->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  lVar9 = (long)(pTVar5->bottom_).super_RepeatedPtrFieldBase.current_size_;
  local_a0 = pTVar6;
  if (lVar9 != 0) {
    lVar12 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,*(value_type **)((long)ppvVar10 + lVar12));
      lVar12 = lVar12 + 8;
    } while (lVar9 * 8 != lVar12);
  }
  pRVar2 = (pTVar5->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  lVar9 = (long)(pTVar5->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar9 != 0) {
    lVar12 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,*(value_type **)((long)ppvVar10 + lVar12));
      lVar12 = lVar12 + 8;
    } while (lVar9 * 8 != lVar12);
  }
  convertCaffeMetadata
            ((pTVar5->name_).ptr_,&local_58,&local_78,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_a8,
             in_stack_00000028);
  pRVar11 = pTVar5->reduction_param_;
  if (pRVar11 == (ReductionParameter *)0x0) {
    pRVar11 = (ReductionParameter *)&caffe::_ReductionParameter_default_instance_;
  }
  pTVar6 = local_a0;
  if (pRVar11->axis_ != 0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"axis","");
    uVar1 = pRVar11->axis_;
    __val = -uVar1;
    if (0 < (int)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar7 = (uint)uVar8;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_003e3eb2;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_003e3eb2;
        }
        if (uVar7 < 10000) goto LAB_003e3eb2;
        uVar8 = uVar8 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_003e3eb2:
    local_a8 = (pTVar5->name_).ptr_;
    local_38 = (pTVar5->type_).ptr_;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)__len - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_98._M_dataplus._M_p + (uVar1 >> 0x1f),__len,__val);
    unsupportedCaffeParrameterWithOption(&local_c8,local_a8,local_38,&local_98);
    pTVar6 = local_a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (pTVar6->_oneof_case_[0] != 0x118) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar6);
    pTVar6->_oneof_case_[0] = 0x118;
    this = (ReduceLayerParams *)operator_new(0x20);
    CoreML::Specification::ReduceLayerParams::ReduceLayerParams(this);
    (pTVar6->layer_).reduce_ = this;
  }
  if (pRVar11->operation_ - 1U < 4) {
    pCVar3 = (pTVar6->layer_).convolution_;
    switch(pRVar11->operation_) {
    case 1:
      (pCVar3->kernelsize_).current_size_ = 0;
      break;
    case 2:
      (pCVar3->kernelsize_).current_size_ = 5;
      break;
    case 3:
      (pCVar3->kernelsize_).current_size_ = 4;
      break;
    case 4:
      (pCVar3->kernelsize_).current_size_ = 1;
    }
  }
  else {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"operation not set","");
    errorInCaffeProto(&local_c8,(pTVar5->name_).ptr_,(pTVar5->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeReduction(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ReductionParameter& caffeLayerParams = caffeLayer.reduction_param();
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.axis() != 0){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.axis()));
    }
    //***************************************************************
    
    Specification::ReduceLayerParams* specLayerParams = specLayer->mutable_reduce();
    switch(caffeLayerParams.operation()) {
        case caffe::ReductionParameter::ASUM:
            specLayerParams->set_mode(Specification::ReduceLayerParams::L1);
            break;
        case caffe::ReductionParameter::SUM:
            specLayerParams->set_mode(Specification::ReduceLayerParams::SUM);
            break;
        case caffe::ReductionParameter::SUMSQ:
            specLayerParams->set_mode(Specification::ReduceLayerParams::SUMSQUARE);
            break;
        case caffe::ReductionParameter::MEAN:
            specLayerParams->set_mode(Specification::ReduceLayerParams::AVG);
            break;
        default:
            CoreMLConverter::errorInCaffeProto("operation not set",caffeLayer.name(), caffeLayer.type());
    }
}